

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O2

void add_reset(ROOM_INDEX_DATA *room,RESET_DATA *pReset,int index)

{
  RESET_DATA *pRVar1;
  RESET_DATA *pRVar2;
  int iVar3;
  bool bVar4;
  
  pRVar1 = room->reset_first;
  if (pRVar1 == (RESET_DATA *)0x0) {
    room->reset_first = pReset;
    room->reset_last = pReset;
    pReset->next = (RESET_DATA *)0x0;
    return;
  }
  if (index == 1) {
    pReset->next = pRVar1;
    room->reset_first = pReset;
    return;
  }
  iVar3 = index + -2;
  do {
    pRVar2 = pRVar1;
    pRVar1 = pRVar2->next;
    bVar4 = iVar3 != 0;
    iVar3 = iVar3 + -1;
    if (pRVar1 == (RESET_DATA *)0x0) break;
  } while (bVar4);
  pReset->next = pRVar1;
  pRVar2->next = pReset;
  if (pReset->next != (RESET_DATA *)0x0) {
    return;
  }
  room->reset_last = pReset;
  return;
}

Assistant:

void add_reset(ROOM_INDEX_DATA *room, RESET_DATA *pReset, int index)
{
	RESET_DATA *reset;
	int iReset = 0;

	if (!room->reset_first)
	{
		room->reset_first = pReset;
		room->reset_last = pReset;
		pReset->next = nullptr;
		return;
	}

	index--;

	if (index == 0) /* First slot (1) selected. */
	{
		pReset->next = room->reset_first;
		room->reset_first = pReset;
		return;
	}

	/*
	 * If negative slot( <= 0 selected) then this will find the last.
	 */
	for (reset = room->reset_first; reset->next; reset = reset->next)
	{
		if (++iReset == index)
			break;
	}

	pReset->next = reset->next;
	reset->next = pReset;

	if (!pReset->next)
		room->reset_last = pReset;

	return;
}